

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O2

string * __thiscall
ObjectFileRecord::to_unique_name_abi_cxx11_(string *__return_storage_ptr__,ObjectFileRecord *this)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&this->name,"-v");
  std::__cxx11::to_string(&local_50,this->version);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectFileRecord::to_unique_name() const {
  return name + "-v" + std::to_string(version);
}